

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::SquaredNorm::backward_impl
          (SquaredNorm *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  Index size;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ushort uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  int iVar26;
  int iVar27;
  ulong uVar12;
  
  if (i != 0) {
    __assert_fail("i < 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x7fb,
                  "virtual void cnn::SquaredNorm::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  iVar26 = 1;
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  iVar27 = 1;
  uVar12 = (ulong)(pTVar1->d).nd;
  if (uVar12 != 0) {
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar13 = 0;
    auVar22 = vpbroadcastq_avx512f();
    do {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vmovdqa64_avx512f(auVar19);
      auVar19 = vporq_avx512f(auVar23,auVar20);
      auVar23 = vporq_avx512f(auVar23,auVar21);
      uVar8 = vpcmpuq_avx512f(auVar23,auVar22,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar19,auVar22,2);
      bVar10 = (byte)uVar8;
      uVar17 = CONCAT11(bVar10,bVar9);
      auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar13));
      auVar23._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar19._4_4_;
      auVar23._0_4_ = (uint)(bVar9 & 1) * auVar19._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar19._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar19._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar19._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar19._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar19._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar19._28_4_;
      auVar23._32_4_ = (uint)(bVar10 & 1) * auVar19._32_4_;
      auVar23._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar19._36_4_;
      auVar23._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar19._40_4_;
      auVar23._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar19._44_4_;
      auVar23._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar19._48_4_;
      auVar23._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar19._52_4_;
      auVar23._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar19._56_4_;
      auVar23._60_4_ = (uint)(bVar10 >> 7) * auVar19._60_4_;
      uVar13 = uVar13 + 0x10;
      auVar19 = vpmulld_avx512f(auVar23,auVar24);
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
    auVar19 = vmovdqa32_avx512f(auVar19);
    auVar20._0_4_ = (uint)(bVar9 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar24._0_4_;
    bVar4 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar24._4_4_;
    bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar24._8_4_;
    bVar4 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar24._12_4_;
    bVar4 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar4 * auVar19._16_4_ | (uint)!bVar4 * auVar24._16_4_;
    bVar4 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar4 * auVar19._20_4_ | (uint)!bVar4 * auVar24._20_4_;
    bVar4 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar4 * auVar19._24_4_ | (uint)!bVar4 * auVar24._24_4_;
    bVar4 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar4 * auVar19._28_4_ | (uint)!bVar4 * auVar24._28_4_;
    auVar20._32_4_ =
         (uint)(bVar10 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar24._32_4_;
    bVar4 = (bool)(bVar10 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar4 * auVar19._36_4_ | (uint)!bVar4 * auVar24._36_4_;
    bVar4 = (bool)(bVar10 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar4 * auVar19._40_4_ | (uint)!bVar4 * auVar24._40_4_;
    bVar4 = (bool)(bVar10 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar4 * auVar19._44_4_ | (uint)!bVar4 * auVar24._44_4_;
    bVar4 = (bool)(bVar10 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar4 * auVar19._48_4_ | (uint)!bVar4 * auVar24._48_4_;
    bVar4 = (bool)(bVar10 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar4 * auVar19._52_4_ | (uint)!bVar4 * auVar24._52_4_;
    bVar4 = (bool)(bVar10 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar4 * auVar19._56_4_ | (uint)!bVar4 * auVar24._56_4_;
    auVar20._60_4_ =
         (uint)(bVar10 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar24._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar20,1);
    auVar19 = vpmulld_avx512f(auVar20,ZEXT3264(auVar18));
    auVar6 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    iVar26 = auVar6._0_4_;
  }
  pfVar2 = pTVar1->v;
  uVar12 = (ulong)(dEdxi->d).nd;
  fVar5 = *dEdf->v + *dEdf->v;
  if (uVar12 != 0) {
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar22 = vpbroadcastq_avx512f();
    uVar13 = 0;
    do {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vmovdqa64_avx512f(auVar19);
      auVar19 = vporq_avx512f(auVar23,auVar20);
      auVar23 = vporq_avx512f(auVar23,auVar21);
      uVar8 = vpcmpuq_avx512f(auVar23,auVar22,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar19,auVar22,2);
      bVar10 = (byte)uVar8;
      uVar17 = CONCAT11(bVar10,bVar9);
      auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar13));
      auVar25._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar19._4_4_;
      auVar25._0_4_ = (uint)(bVar9 & 1) * auVar19._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar19._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar19._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar19._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar19._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar19._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar19._28_4_;
      auVar25._32_4_ = (uint)(bVar10 & 1) * auVar19._32_4_;
      auVar25._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar19._36_4_;
      auVar25._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar19._40_4_;
      auVar25._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar19._44_4_;
      auVar25._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar19._48_4_;
      auVar25._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar19._52_4_;
      auVar25._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar19._56_4_;
      auVar25._60_4_ = (uint)(bVar10 >> 7) * auVar19._60_4_;
      uVar13 = uVar13 + 0x10;
      auVar19 = vpmulld_avx512f(auVar25,auVar24);
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
    auVar19 = vmovdqa32_avx512f(auVar19);
    auVar21._0_4_ = (uint)(bVar9 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar24._0_4_;
    bVar4 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar24._4_4_;
    bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar24._8_4_;
    bVar4 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar24._12_4_;
    bVar4 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar21._16_4_ = (uint)bVar4 * auVar19._16_4_ | (uint)!bVar4 * auVar24._16_4_;
    bVar4 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar21._20_4_ = (uint)bVar4 * auVar19._20_4_ | (uint)!bVar4 * auVar24._20_4_;
    bVar4 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar21._24_4_ = (uint)bVar4 * auVar19._24_4_ | (uint)!bVar4 * auVar24._24_4_;
    bVar4 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar21._28_4_ = (uint)bVar4 * auVar19._28_4_ | (uint)!bVar4 * auVar24._28_4_;
    auVar21._32_4_ =
         (uint)(bVar10 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar24._32_4_;
    bVar4 = (bool)(bVar10 >> 1 & 1);
    auVar21._36_4_ = (uint)bVar4 * auVar19._36_4_ | (uint)!bVar4 * auVar24._36_4_;
    bVar4 = (bool)(bVar10 >> 2 & 1);
    auVar21._40_4_ = (uint)bVar4 * auVar19._40_4_ | (uint)!bVar4 * auVar24._40_4_;
    bVar4 = (bool)(bVar10 >> 3 & 1);
    auVar21._44_4_ = (uint)bVar4 * auVar19._44_4_ | (uint)!bVar4 * auVar24._44_4_;
    bVar4 = (bool)(bVar10 >> 4 & 1);
    auVar21._48_4_ = (uint)bVar4 * auVar19._48_4_ | (uint)!bVar4 * auVar24._48_4_;
    bVar4 = (bool)(bVar10 >> 5 & 1);
    auVar21._52_4_ = (uint)bVar4 * auVar19._52_4_ | (uint)!bVar4 * auVar24._52_4_;
    bVar4 = (bool)(bVar10 >> 6 & 1);
    auVar21._56_4_ = (uint)bVar4 * auVar19._56_4_ | (uint)!bVar4 * auVar24._56_4_;
    auVar21._60_4_ =
         (uint)(bVar10 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar24._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar21,1);
    auVar19 = vpmulld_avx512f(auVar21,ZEXT3264(auVar18));
    auVar6 = vpmulld_avx(auVar19._0_16_,auVar19._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmulld_avx(auVar6,auVar7);
    iVar27 = auVar6._0_4_;
  }
  uVar11 = iVar27 * (dEdxi->d).bd;
  uVar12 = (ulong)uVar11;
  pfVar3 = dEdxi->v;
  if (uVar11 != iVar26 * (pTVar1->d).bd) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  uVar13 = uVar12;
  if ((((ulong)pfVar3 & 3) == 0) &&
     (uVar13 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 0xf), uVar12 <= uVar13)) {
    uVar13 = uVar12;
  }
  uVar15 = uVar12 - uVar13;
  uVar14 = uVar15 + 0xf;
  if (-1 < (long)uVar15) {
    uVar14 = uVar15;
  }
  if (uVar13 != 0) {
    uVar16 = 0;
    do {
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar16]),ZEXT416((uint)fVar5),
                               ZEXT416((uint)pfVar3[uVar16]));
      pfVar3[uVar16] = auVar6._0_4_;
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
  }
  uVar14 = (uVar14 & 0xfffffffffffffff0) + uVar13;
  if (0xf < (long)uVar15) {
    auVar19 = vbroadcastss_avx512f(ZEXT416((uint)fVar5));
    do {
      auVar20 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar2 + uVar13),auVar19,
                                    *(undefined1 (*) [64])(pfVar3 + uVar13));
      *(undefined1 (*) [64])(pfVar3 + uVar13) = auVar20;
      uVar13 = uVar13 + 0x10;
    } while ((long)uVar13 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar12) {
    do {
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar14]),ZEXT416((uint)fVar5),
                               ZEXT416((uint)pfVar3[uVar14]));
      pfVar3[uVar14] = auVar6._0_4_;
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
  }
  return;
}

Assistant:

void SquaredNorm::backward_impl(const vector<const Tensor*>& xs,
                                 const Tensor& fx,
                                 const Tensor& dEdf,
                                 unsigned i,
                                 Tensor& dEdxi) const {
  assert(i < 1);
#if HAVE_CUDA
  throw std::runtime_error("SquaredNorm not yet implemented for CUDA");
#else
  real scale = dEdf.v[0] * 2;
  dEdxi.vec().noalias() += scale * xs[0]->vec();
#endif
}